

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permissions.cpp
# Opt level: O1

bool fs_set_permissions(string_view path,int readable,int writable,int executable)

{
  string_view path_00;
  string_view path_01;
  bool bVar1;
  char *pcVar2;
  string_view fname;
  int iVar3;
  undefined4 in_stack_ffffffffffffff94;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  path local_50;
  
  local_60._M_str = path._M_str;
  local_60._M_len = path._M_len;
  iVar3 = 0;
  pcVar2 = (char *)std::_V2::system_category();
  path_00._M_len._4_4_ = in_stack_ffffffffffffff94;
  path_00._M_len._0_4_ = iVar3;
  path_00._M_str = pcVar2;
  bVar1 = fs_exists(path_00);
  if (!bVar1) {
    std::_V2::generic_category();
    iVar3 = 2;
  }
  if ((readable != 0) && (iVar3 == 0)) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_50,&local_60,auto_format);
    std::filesystem::permissions
              (&local_50,owner_read,(uint)(readable < 1) * 2 + add,
               (error_code *)&stack0xffffffffffffff90);
    std::filesystem::__cxx11::path::~path(&local_50);
  }
  if ((writable != 0) && (iVar3 == 0)) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_50,&local_60,auto_format);
    std::filesystem::permissions
              (&local_50,owner_write,(uint)(writable < 1) * 2 + add,
               (error_code *)&stack0xffffffffffffff90);
    std::filesystem::__cxx11::path::~path(&local_50);
  }
  if ((executable != 0) && (iVar3 == 0)) {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_50,&local_60,auto_format);
    std::filesystem::permissions
              (&local_50,owner_exec,(uint)(executable < 1) * 2 + add,
               (error_code *)&stack0xffffffffffffff90);
    std::filesystem::__cxx11::path::~path(&local_50);
  }
  if (iVar3 != 0) {
    path_01._M_str = local_60._M_str;
    path_01._M_len = local_60._M_len;
    fname._M_str = "fs_set_permissions";
    fname._M_len = 0x12;
    fs_print_error(path_01,fname,(error_code *)&stack0xffffffffffffff90);
  }
  return iVar3 == 0;
}

Assistant:

bool fs_set_permissions(std::string_view path, int readable, int writable, int executable)
{
// only sets permission for owner, not group or others

#ifdef HAVE_CXX_FILESYSTEM

#if defined(__cpp_using_enum)  // C++20
  using enum std::filesystem::perms;
#else
  constexpr std::filesystem::perms owner_read = std::filesystem::perms::owner_read;
  constexpr std::filesystem::perms owner_write = std::filesystem::perms::owner_write;
  constexpr std::filesystem::perms owner_exec = std::filesystem::perms::owner_exec;
#endif

  std::error_code ec;
  // need to error if path doesn't exist and no operations are requested
  if(!fs_exists(path))
    ec = std::make_error_code(std::errc::no_such_file_or_directory);

  if (!ec && readable != 0)
    std::filesystem::permissions(path, owner_read,
      (readable > 0) ? std::filesystem::perm_options::add : std::filesystem::perm_options::remove,
      ec);

  if (!ec && writable != 0)
    std::filesystem::permissions(path, owner_write,
      (writable > 0) ? std::filesystem::perm_options::add : std::filesystem::perm_options::remove,
      ec);

  if (!ec && executable != 0)
    std::filesystem::permissions(path, owner_exec,
      (executable > 0) ? std::filesystem::perm_options::add : std::filesystem::perm_options::remove,
      ec);

  if(!ec) FFS_LIKELY
    return true;

  fs_print_error(path, __func__, ec);
  return false;

#else

  int m = fs_st_mode(path);
#ifdef _MSC_VER
  constexpr int r = _S_IREAD;
  constexpr int w = _S_IWRITE;
  constexpr int x = _S_IEXEC;
#else
  constexpr int r = S_IRUSR;
  constexpr int w = S_IWUSR;
  constexpr int x = S_IXUSR;
#endif

  if(readable > 0)
    m |= r;
  else if (readable < 0)
    m &= ~r;

  if(writable > 0)
    m |= w;
  else if (writable < 0)
    m &= ~w;

  if(executable > 0)
    m |= x;
  else if (executable < 0)
    m &= ~x;
// https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/chmod-wchmod
#ifdef _MSC_VER
  return _chmod(path.data(), m) == 0;
#else
  return chmod(path.data(), m) == 0;
#endif

#endif
}